

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O0

void __thiscall CTcLibParser::scan_needmacro(CTcLibParser *this,char *val)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  char *in_RSI;
  long *in_RDI;
  bool bVar4;
  size_t macro_len;
  char *macro_name;
  char *p;
  char *local_18;
  
  local_18 = in_RSI;
  while (pcVar1 = local_18, iVar2 = isspace((int)*local_18), iVar2 != 0) {
    local_18 = local_18 + 1;
  }
  while( true ) {
    bVar4 = false;
    if (*local_18 != '\0') {
      iVar2 = isspace((int)*local_18);
      bVar4 = iVar2 == 0;
    }
    if (!bVar4) break;
    local_18 = local_18 + 1;
  }
  lVar3 = (long)local_18 - (long)pcVar1;
  while (iVar2 = isspace((int)*local_18), iVar2 != 0) {
    local_18 = local_18 + 1;
  }
  (**(code **)(*in_RDI + 0x80))(in_RDI,pcVar1,lVar3,local_18);
  return;
}

Assistant:

void CTcLibParser::scan_needmacro(const char *val)
{
    const char *p;
    const char *macro_name;
    size_t macro_len;

    /* skip leading whitespace */
    for (p = val ; isspace(*p) ; ++p) ;

    /* the macro starts here */
    macro_name = p;

    /* find the next whitspace, which separates the token */
    for ( ; *p != '\0' && !isspace(*p) ; ++p) ;

    /* note the length of the macro name */
    macro_len = p - macro_name;

    /* skip the whitspace */
    for ( ; isspace(*p) ; ++p) ;

    /* process the parsed needmacro definition */
    scan_parsed_needmacro(macro_name, macro_len, p);
}